

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O0

void process_ctl(ps_decoder_t *ps,cmd_ln_t *config,FILE *ctlfh)

{
  int iVar1;
  long lVar2;
  char *latdir;
  char *nbestdir_00;
  char *pcVar3;
  ps_seg_t *itor_00;
  char *local_170;
  char *local_168;
  ps_seg_t *itor;
  char *align_hyp;
  char *pcStack_140;
  int32 score;
  char *uttid;
  char *file;
  char *hyp;
  char *alignfile;
  char *alignline;
  char *mllrfile;
  char *lmname;
  char *fsgfile;
  char *fsgline;
  char *lmline;
  char *mllrline;
  int local_e0;
  int32 ef;
  int32 sf;
  int32 nf;
  char *wptr [4];
  int frate;
  char *str;
  char *nbestdir;
  char *outlatdir;
  double n_wall;
  double n_cpu;
  double n_speech;
  FILE *alignfh;
  FILE *fsgfh;
  FILE *lmfh;
  FILE *mllrfh;
  FILE *ctmfh;
  FILE *hypsegfh;
  FILE *hypfh;
  size_t len;
  char *line;
  int32 i;
  int32 ctlincr;
  int32 ctlcount;
  int32 ctloffset;
  FILE *ctlfh_local;
  cmd_ln_t *config_local;
  ps_decoder_t *ps_local;
  
  hypsegfh = (FILE *)0x0;
  ctmfh = (FILE *)0x0;
  mllrfh = (FILE *)0x0;
  lmfh = (FILE *)0x0;
  fsgfh = (FILE *)0x0;
  alignfh = (FILE *)0x0;
  n_speech = 0.0;
  _ctlcount = ctlfh;
  ctlfh_local = (FILE *)config;
  config_local = (cmd_ln_t *)ps;
  lVar2 = ps_config_int(config,"ctloffset");
  ctlincr = (int32)lVar2;
  lVar2 = ps_config_int((cmd_ln_t *)ctlfh_local,"ctlcount");
  i = (int32)lVar2;
  lVar2 = ps_config_int((cmd_ln_t *)ctlfh_local,"ctlincr");
  line._4_4_ = (int)lVar2;
  latdir = ps_config_str((cmd_ln_t *)ctlfh_local,"outlatdir");
  nbestdir_00 = ps_config_str((cmd_ln_t *)ctlfh_local,"nbestdir");
  lVar2 = ps_config_int((cmd_ln_t *)ctlfh_local,"frate");
  pcVar3 = ps_config_str((cmd_ln_t *)ctlfh_local,"mllrctl");
  if ((pcVar3 == (char *)0x0) || (lmfh = (FILE *)fopen(pcVar3,"r"), (FILE *)lmfh != (FILE *)0x0)) {
    pcVar3 = ps_config_str((cmd_ln_t *)ctlfh_local,"fsgctl");
    if ((pcVar3 == (char *)0x0) ||
       (alignfh = (FILE *)fopen(pcVar3,"r"), (FILE *)alignfh != (FILE *)0x0)) {
      pcVar3 = ps_config_str((cmd_ln_t *)ctlfh_local,"alignctl");
      if ((pcVar3 == (char *)0x0) ||
         (n_speech = (double)fopen(pcVar3,"r"), (FILE *)n_speech != (FILE *)0x0)) {
        pcVar3 = ps_config_str((cmd_ln_t *)ctlfh_local,"lmnamectl");
        if ((pcVar3 == (char *)0x0) ||
           (fsgfh = (FILE *)fopen(pcVar3,"r"), (FILE *)fsgfh != (FILE *)0x0)) {
          pcVar3 = ps_config_str((cmd_ln_t *)ctlfh_local,"hyp");
          if (pcVar3 != (char *)0x0) {
            hypsegfh = (FILE *)fopen(pcVar3,"w");
            if ((FILE *)hypsegfh == (FILE *)0x0) {
              err_msg_system(ERR_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                             ,0x2de,"Failed to open hypothesis file %s for writing",pcVar3);
              goto LAB_0010828a;
            }
            setbuf((FILE *)hypsegfh,(char *)0x0);
          }
          pcVar3 = ps_config_str((cmd_ln_t *)ctlfh_local,"hypseg");
          if (pcVar3 != (char *)0x0) {
            ctmfh = (FILE *)fopen(pcVar3,"w");
            if ((FILE *)ctmfh == (FILE *)0x0) {
              err_msg_system(ERR_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                             ,0x2e6,"Failed to open hypothesis file %s for writing",pcVar3);
              goto LAB_0010828a;
            }
            setbuf((FILE *)ctmfh,(char *)0x0);
          }
          pcVar3 = ps_config_str((cmd_ln_t *)ctlfh_local,"ctm");
          if (pcVar3 != (char *)0x0) {
            mllrfh = (FILE *)fopen(pcVar3,"w");
            if ((FILE *)mllrfh == (FILE *)0x0) {
              err_msg_system(ERR_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                             ,0x2ee,"Failed to open hypothesis file %s for writing",pcVar3);
              goto LAB_0010828a;
            }
            setbuf((FILE *)mllrfh,(char *)0x0);
          }
          line._0_4_ = 0;
          while (len = (size_t)fread_line(_ctlcount,(size_t *)&hypfh), (char *)len != (char *)0x0) {
            lmline = (char *)0x0;
            fsgline = (char *)0x0;
            fsgfile = (char *)0x0;
            lmname = (char *)0x0;
            mllrfile = (char *)0x0;
            alignline = (char *)0x0;
            alignfile = (char *)0x0;
            hyp = (char *)0x0;
            if (lmfh != (FILE *)0x0) {
              lmline = fread_line(lmfh,(size_t *)&hypfh);
              if (lmline == (char *)0x0) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                        ,0x2ff,"File size mismatch between control and MLLR control\n");
                ckd_free((void *)len);
                ckd_free(lmline);
                goto LAB_0010828a;
              }
              alignline = string_trim(lmline,STRING_BOTH);
            }
            if (fsgfh != (FILE *)0x0) {
              fsgline = fread_line(fsgfh,(size_t *)&hypfh);
              if (fsgline == (char *)0x0) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                        ,0x309,"File size mismatch between control and LM control\n");
                ckd_free((void *)len);
                ckd_free(fsgline);
                goto LAB_0010828a;
              }
              mllrfile = string_trim(fsgline,STRING_BOTH);
            }
            if (alignfh != (FILE *)0x0) {
              fsgfile = fread_line(alignfh,(size_t *)&hypfh);
              if (fsgfile == (char *)0x0) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                        ,0x313,"File size mismatch between control and FSG control\n");
                ckd_free((void *)len);
                ckd_free(fsgfile);
                goto LAB_0010828a;
              }
              lmname = string_trim(fsgfile,STRING_BOTH);
            }
            if (n_speech != 0.0) {
              alignfile = fread_line((FILE *)n_speech,(size_t *)&hypfh);
              if (alignfile == (char *)0x0) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                        ,0x31d,"File size mismatch between control and align control\n");
                ckd_free((void *)len);
                ckd_free(alignfile);
                goto LAB_0010828a;
              }
              hyp = string_trim(alignfile,STRING_BOTH);
            }
            if ((int)(uint)line < ctlincr) {
              line._0_4_ = line._4_4_ + (uint)line;
              goto LAB_001081cd;
            }
            if ((i != -1) && (ctlincr + i <= (int)(uint)line)) goto LAB_001081cd;
            local_e0 = 0;
            mllrline._4_4_ = -1;
            ef = str2words((char *)len,(char **)&sf,4);
            if (ef == 0) goto LAB_001081c4;
            if (ef < 0) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                      ,0x334,"Unexpected extra data in control file at line %d\n",(ulong)(uint)line)
              ;
              goto LAB_001081c4;
            }
            file = (char *)0x0;
            uttid = _sf;
            if (1 < ef) {
              local_e0 = atoi(wptr[0]);
            }
            if (2 < ef) {
              mllrline._4_4_ = atoi(wptr[1]);
            }
            if (ef < 4) {
              pcStack_140 = uttid;
            }
            else {
              pcStack_140 = wptr[2];
            }
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                    ,0x344,"Decoding \'%s\'\n",pcStack_140);
            iVar1 = process_mllrctl_line
                              ((ps_decoder_t *)config_local,(cmd_ln_t *)ctlfh_local,alignline);
            if ((((-1 < iVar1) &&
                 (iVar1 = process_lmnamectl_line
                                    ((ps_decoder_t *)config_local,(cmd_ln_t *)ctlfh_local,mllrfile),
                 -1 < iVar1)) &&
                (iVar1 = process_fsgctl_line((ps_decoder_t *)config_local,(cmd_ln_t *)ctlfh_local,
                                             lmname), -1 < iVar1)) &&
               ((iVar1 = process_alignctl_line
                                   ((ps_decoder_t *)config_local,(cmd_ln_t *)ctlfh_local,hyp),
                -1 < iVar1 &&
                (iVar1 = process_ctl_line((ps_decoder_t *)config_local,(cmd_ln_t *)ctlfh_local,uttid
                                          ,pcStack_140,local_e0,mllrline._4_4_), -1 < iVar1)))) {
              if (hypsegfh != (FILE *)0x0) {
                if (hyp == (char *)0x0) {
                  file = ps_get_hyp((ps_decoder_t *)config_local,(int32 *)((long)&align_hyp + 4));
                  local_168 = file;
                  if (file == (char *)0x0) {
                    local_168 = "";
                  }
                  fprintf((FILE *)hypsegfh,"%s (%s %d)\n",local_168,pcStack_140,
                          (ulong)align_hyp._4_4_);
                }
                else {
                  pcVar3 = get_align_hyp((ps_decoder_t *)config_local,(int *)((long)&align_hyp + 4))
                  ;
                  fprintf((FILE *)hypsegfh,"%s (%s %d)\n",pcVar3,pcStack_140,(ulong)align_hyp._4_4_)
                  ;
                  ckd_free(pcVar3);
                }
              }
              if (ctmfh != (FILE *)0x0) {
                write_hypseg(ctmfh,(ps_decoder_t *)config_local,pcStack_140);
              }
              if (mllrfh != (FILE *)0x0) {
                itor_00 = ps_seg_iter((ps_decoder_t *)config_local);
                write_ctm(mllrfh,(ps_decoder_t *)config_local,itor_00,pcStack_140,(int32)lVar2);
              }
              if (latdir != (char *)0x0) {
                write_lattice((ps_decoder_t *)config_local,latdir,pcStack_140);
              }
              if (nbestdir_00 != (char *)0x0) {
                write_nbest((ps_decoder_t *)config_local,nbestdir_00,pcStack_140);
              }
              ps_get_utt_time((ps_decoder_t *)config_local,&n_cpu,&n_wall,(double *)&outlatdir);
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                      ,0x370,"%s: %.2f seconds speech, %.2f seconds CPU, %.2f seconds wall\n",n_cpu,
                      n_wall,outlatdir,pcStack_140);
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                      ,0x372,"%s: %.2f xRT (CPU), %.2f xRT (elapsed)\n",n_wall / n_cpu,
                      (double)outlatdir / n_cpu,pcStack_140);
              if (file == (char *)0x0) {
                local_170 = "";
              }
              else {
                local_170 = file;
              }
              err_msg(ERR_INFO,(char *)0x0,0,"%s (%s %d)\n",local_170,pcStack_140,align_hyp._4_4_);
              err_msg(ERR_INFO,(char *)0x0,0,"%s done --------------------------------------\n",
                      pcStack_140);
LAB_001081c4:
              line._0_4_ = line._4_4_ + (uint)line;
LAB_001081cd:
              ckd_free(alignfile);
              ckd_free(lmline);
              ckd_free(fsgfile);
              ckd_free(fsgline);
              ckd_free((void *)len);
            }
          }
          ps_get_all_time((ps_decoder_t *)config_local,&n_cpu,&n_wall,(double *)&outlatdir);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                  ,0x382,"TOTAL %.2f seconds speech, %.2f seconds CPU, %.2f seconds wall\n",n_cpu,
                  n_wall,outlatdir);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                  ,900,"AVERAGE %.2f xRT (CPU), %.2f xRT (elapsed)\n",n_wall / n_cpu,
                  (double)outlatdir / n_cpu);
        }
        else {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                         ,0x2d7,"Failed to open LM name control file file %s",pcVar3);
        }
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                       ,0x2d0,"Failed to open alignment control file file %s",pcVar3);
      }
    }
    else {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                     ,0x2c9,"Failed to open FSG control file file %s",pcVar3);
    }
  }
  else {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                   ,0x2c2,"Failed to open MLLR control file file %s",pcVar3);
  }
LAB_0010828a:
  if (hypsegfh != (FILE *)0x0) {
    fclose((FILE *)hypsegfh);
  }
  if (ctmfh != (FILE *)0x0) {
    fclose((FILE *)ctmfh);
  }
  if (mllrfh != (FILE *)0x0) {
    fclose((FILE *)mllrfh);
  }
  if (n_speech != 0.0) {
    fclose((FILE *)n_speech);
  }
  return;
}

Assistant:

static void
process_ctl(ps_decoder_t *ps, cmd_ln_t *config, FILE *ctlfh)
{
    int32 ctloffset, ctlcount, ctlincr;
    int32 i;
    char *line;
    size_t len;
    FILE *hypfh = NULL, *hypsegfh = NULL, *ctmfh = NULL;
    FILE *mllrfh = NULL, *lmfh = NULL, *fsgfh = NULL, *alignfh = NULL;
    double n_speech, n_cpu, n_wall;
    char const *outlatdir;
    char const *nbestdir;
    char const *str;
    int frate;

    ctloffset = ps_config_int(config, "ctloffset");
    ctlcount = ps_config_int(config, "ctlcount");
    ctlincr = ps_config_int(config, "ctlincr");
    outlatdir = ps_config_str(config, "outlatdir");
    nbestdir = ps_config_str(config, "nbestdir");
    frate = ps_config_int(config, "frate");

    if ((str = ps_config_str(config, "mllrctl"))) {
        mllrfh = fopen(str, "r");
        if (mllrfh == NULL) {
            E_ERROR_SYSTEM("Failed to open MLLR control file file %s", str);
            goto done;
        }
    }
    if ((str = ps_config_str(config, "fsgctl"))) {
        fsgfh = fopen(str, "r");
        if (fsgfh == NULL) {
            E_ERROR_SYSTEM("Failed to open FSG control file file %s", str);
            goto done;
        }
    }
    if ((str = ps_config_str(config, "alignctl"))) {
        alignfh = fopen(str, "r");
        if (alignfh == NULL) {
            E_ERROR_SYSTEM("Failed to open alignment control file file %s", str);
            goto done;
        }
    }
    if ((str = ps_config_str(config, "lmnamectl"))) {
        lmfh = fopen(str, "r");
        if (lmfh == NULL) {
            E_ERROR_SYSTEM("Failed to open LM name control file file %s", str);
            goto done;
        }
    }
    if ((str = ps_config_str(config, "hyp"))) {
        hypfh = fopen(str, "w");
        if (hypfh == NULL) {
            E_ERROR_SYSTEM("Failed to open hypothesis file %s for writing", str);
            goto done;
        }
        setbuf(hypfh, NULL);
    }
    if ((str = ps_config_str(config, "hypseg"))) {
        hypsegfh = fopen(str, "w");
        if (hypsegfh == NULL) {
            E_ERROR_SYSTEM("Failed to open hypothesis file %s for writing", str);
            goto done;
        }
        setbuf(hypsegfh, NULL);
    }
    if ((str = ps_config_str(config, "ctm"))) {
        ctmfh = fopen(str, "w");
        if (ctmfh == NULL) {
            E_ERROR_SYSTEM("Failed to open hypothesis file %s for writing", str);
            goto done;
        }
        setbuf(ctmfh, NULL);
    }

    i = 0;
    while ((line = fread_line(ctlfh, &len))) {
        char *wptr[4];
        int32 nf, sf, ef;
        char *mllrline = NULL, *lmline = NULL, *fsgline = NULL;
        char *fsgfile = NULL, *lmname = NULL, *mllrfile = NULL;
        char *alignline = NULL, *alignfile = NULL;

        if (mllrfh) {
            mllrline = fread_line(mllrfh, &len);
            if (mllrline == NULL) {
                E_ERROR("File size mismatch between control and MLLR control\n");
                ckd_free(line);
                ckd_free(mllrline);
                goto done;
            }
            mllrfile = string_trim(mllrline, STRING_BOTH);
        }
        if (lmfh) {
            lmline = fread_line(lmfh, &len);
            if (lmline == NULL) {
                E_ERROR("File size mismatch between control and LM control\n");
                ckd_free(line);
                ckd_free(lmline);
                goto done;
            }
            lmname = string_trim(lmline, STRING_BOTH);
        }
        if (fsgfh) {
            fsgline = fread_line(fsgfh, &len);
            if (fsgline == NULL) {
                E_ERROR("File size mismatch between control and FSG control\n");
                ckd_free(line);
                ckd_free(fsgline);
                goto done;
            }
            fsgfile = string_trim(fsgline, STRING_BOTH);
        }
        if (alignfh) {
            alignline = fread_line(alignfh, &len);
            if (alignline == NULL) {
                E_ERROR("File size mismatch between control and align control\n");
                ckd_free(line);
                ckd_free(alignline);
                goto done;
            }
            alignfile = string_trim(alignline, STRING_BOTH);
        }

        if (i < ctloffset) {
            i += ctlincr;
            goto nextline;
        }
        if (ctlcount != -1 && i >= ctloffset + ctlcount) {
            goto nextline;
        }

        sf = 0;
        ef = -1;
        nf = str2words(line, wptr, 4);
        if (nf == 0) {
            /* Do nothing. */
        }
        else if (nf < 0) {
            E_ERROR("Unexpected extra data in control file at line %d\n", i);
        }
        else {
            char const *hyp = NULL, *file, *uttid;
            int32 score;

            file = wptr[0];
            if (nf > 1)
                sf = atoi(wptr[1]);
            if (nf > 2)
                ef = atoi(wptr[2]);
            if (nf > 3)
                uttid = wptr[3];
            else
        	uttid = file;

            E_INFO("Decoding '%s'\n", uttid);

            /* Do actual decoding. */
            if(process_mllrctl_line(ps, config, mllrfile) < 0)
                continue;
            if(process_lmnamectl_line(ps, config, lmname) < 0)
                continue;
            if(process_fsgctl_line(ps, config, fsgfile) < 0)
                continue;
            if(process_alignctl_line(ps, config, alignfile) < 0)
                continue;
            if(process_ctl_line(ps, config, file, uttid, sf, ef) < 0)
                continue;
            /* Special case for force-alignment: report silences and
             * alternate pronunciations.  This isn't done
             * automatically because Reasons.  (API consistency but
             * also because force-alignment is really secretly FSG
             * search at the moment). */
            if (hypfh) {
                if (alignfile) {
                    char *align_hyp = get_align_hyp(ps, &score);
                    fprintf(hypfh, "%s (%s %d)\n", align_hyp, uttid, score);
                    ckd_free(align_hyp);
                }
                else {
                    hyp = ps_get_hyp(ps, &score);
                    fprintf(hypfh, "%s (%s %d)\n", hyp ? hyp : "", uttid, score);
                }
            }
            if (hypsegfh) {
                write_hypseg(hypsegfh, ps, uttid);
            }
            if (ctmfh) {
                ps_seg_t *itor = ps_seg_iter(ps);
                write_ctm(ctmfh, ps, itor, uttid, frate);
            }
            if (outlatdir) {
                write_lattice(ps, outlatdir, uttid);
            }
            if (nbestdir) {
                write_nbest(ps, nbestdir, uttid);
            }
            ps_get_utt_time(ps, &n_speech, &n_cpu, &n_wall);
            E_INFO("%s: %.2f seconds speech, %.2f seconds CPU, %.2f seconds wall\n",
                   uttid, n_speech, n_cpu, n_wall);
            E_INFO("%s: %.2f xRT (CPU), %.2f xRT (elapsed)\n",
                   uttid, n_cpu / n_speech, n_wall / n_speech);
            /* help make the logfile somewhat less opaque (air) */
            E_INFO_NOFN("%s (%s %d)\n", hyp ? hyp : "", uttid, score); 
            E_INFO_NOFN("%s done --------------------------------------\n", uttid);
        }
        i += ctlincr;
    nextline:
        ckd_free(alignline);
        ckd_free(mllrline);
        ckd_free(fsgline);
        ckd_free(lmline);
        ckd_free(line);
    }

    ps_get_all_time(ps, &n_speech, &n_cpu, &n_wall);
    E_INFO("TOTAL %.2f seconds speech, %.2f seconds CPU, %.2f seconds wall\n",
           n_speech, n_cpu, n_wall);
    E_INFO("AVERAGE %.2f xRT (CPU), %.2f xRT (elapsed)\n",
           n_cpu / n_speech, n_wall / n_speech);

done:
    if (hypfh)
        fclose(hypfh);
    if (hypsegfh)
        fclose(hypsegfh);
    if (ctmfh)
        fclose(ctmfh);
    if (alignfh)
        fclose(alignfh);
}